

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O0

void __thiscall
jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies::printTo
          (PerOperationSamplingStrategies *this,ostream *out)

{
  ostream *poVar1;
  double *t;
  double *t_00;
  double *t_01;
  string local_a8;
  string local_88;
  string local_68;
  string local_38;
  ostream *local_18;
  ostream *out_local;
  PerOperationSamplingStrategies *this_local;
  
  local_18 = out;
  out_local = (ostream *)this;
  std::operator<<(out,"PerOperationSamplingStrategies(");
  poVar1 = std::operator<<(local_18,"defaultSamplingProbability=");
  apache::thrift::to_string_abi_cxx11_(&local_38,(thrift *)&this->defaultSamplingProbability,t);
  std::operator<<(poVar1,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  poVar1 = std::operator<<(local_18,", ");
  poVar1 = std::operator<<(poVar1,"defaultLowerBoundTracesPerSecond=");
  apache::thrift::to_string_abi_cxx11_
            (&local_68,(thrift *)&this->defaultLowerBoundTracesPerSecond,t_00);
  std::operator<<(poVar1,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  poVar1 = std::operator<<(local_18,", ");
  poVar1 = std::operator<<(poVar1,"perOperationStrategies=");
  apache::thrift::to_string<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>
            (&local_88,&this->perOperationStrategies);
  std::operator<<(poVar1,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  poVar1 = std::operator<<(local_18,", ");
  std::operator<<(poVar1,"defaultUpperBoundTracesPerSecond=");
  poVar1 = local_18;
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<(local_18,"<null>");
  }
  else {
    apache::thrift::to_string_abi_cxx11_
              (&local_a8,(thrift *)&this->defaultUpperBoundTracesPerSecond,t_01);
    std::operator<<(poVar1,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  std::operator<<(local_18,")");
  return;
}

Assistant:

void PerOperationSamplingStrategies::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "PerOperationSamplingStrategies(";
  out << "defaultSamplingProbability=" << to_string(defaultSamplingProbability);
  out << ", " << "defaultLowerBoundTracesPerSecond=" << to_string(defaultLowerBoundTracesPerSecond);
  out << ", " << "perOperationStrategies=" << to_string(perOperationStrategies);
  out << ", " << "defaultUpperBoundTracesPerSecond="; (__isset.defaultUpperBoundTracesPerSecond ? (out << to_string(defaultUpperBoundTracesPerSecond)) : (out << "<null>"));
  out << ")";
}